

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall mpt::array::~array(array *this)

{
  array *this_local;
  
  reference<mpt::array::content>::~reference((reference<mpt::array::content> *)this);
  return;
}

Assistant:

MPT_STRUCT(array)
{
#ifdef __cplusplus
	class content : public buffer
	{
	public:
		inline size_t length() const
		{
			return _used;
		}
		inline size_t left() const
		{
			return _size - _used;
		}
		inline void *data() const
		{
			return static_cast<void *>(const_cast<content *>(this) + 1);
		}
		bool set_length(size_t);
	protected:
		inline ~content()
		{ }
	};
	array(array const&);
	array(size_t = 0);
	
	const content *data() const;
	
	size_t length() const;
	size_t left() const;
	void *base() const;
	bool shared() const;
	
	char *string();
	bool compact();
	
	void *append(size_t , const void * = 0);
	void *prepend(size_t , const void * = 0);
	void *insert(size_t , size_t , const void * = 0);
	void *set(size_t , const void * = 0);
	bool set(const reference<buffer> &);
	
	int set(const value &);
	int set(convertable &);
	int printf(const char *fmt, ... );
	
	array & operator=  (const array &);
	array & operator=  (const slice &);
	array & operator+= (const content &);
	array & operator+= (const span<uint8_t> &);
	array & operator=  (struct ::iovec const&);
	array & operator+= (struct ::iovec const&);
protected:
# define _MPT_ARRAY_TYPE(x)     ::mpt::typed_array<x>
# define _MPT_UARRAY_TYPE(x)    ::mpt::unique_array<x>
# define _MPT_REF_ARRAY_TYPE(x) ::mpt::reference_array<x>
	reference<content> _buf;
#else
	MPT_STRUCT(buffer) *_buf;
# define _MPT_ARRAY_TYPE(x)     MPT_STRUCT(array)
# define _MPT_UARRAY_TYPE(x)    MPT_STRUCT(array)
# define _MPT_REF_ARRAY_TYPE(x) MPT_STRUCT(array)
# define MPT_ARRAY_INIT { 0 }
#endif
}